

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdGetPrivkeyFromWif(void *handle,char *wif,int network_type,char **privkey)

{
  bool bVar1;
  NetType net_type;
  size_t sVar2;
  char *pcVar3;
  CfdException *pCVar4;
  bool is_bitcoin;
  allocator local_69;
  Privkey key;
  string local_48;
  
  cfd::Initialize();
  if (privkey == (char **)0x0) {
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x420;
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdGetPrivkeyFromWif";
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"privkey is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key,"Failed to parameter. privkey is null.",(allocator *)&local_48);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&key);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(wif);
  if (!bVar1) {
    sVar2 = strnlen(wif,0x34);
    is_bitcoin = true;
    net_type = cfd::capi::ConvertNetType(network_type,&is_bitcoin);
    if (is_bitcoin != false) {
      std::__cxx11::string::string((string *)&local_48,wif,&local_69);
      cfd::core::Privkey::FromWif(&key,&local_48,net_type,sVar2 != 0x33);
      std::__cxx11::string::~string((string *)&local_48);
      cfd::core::Privkey::GetHex_abi_cxx11_(&local_48,&key);
      pcVar3 = cfd::capi::CreateString(&local_48);
      *privkey = pcVar3;
      std::__cxx11::string::~string((string *)&local_48);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
      return 0;
    }
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x430;
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdGetPrivkeyFromWif";
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"privkey\'s network_type is invalid.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key,"Failed to parameter. privkey\'s network_type is invalid.",
               (allocator *)&local_48);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&key);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
  key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x426;
  key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdGetPrivkeyFromWif";
  cfd::core::logger::warn<>((CfdSourceLocation *)&key,"wif is null or empty.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&key,"Failed to parameter. wif is null or empty.",(allocator *)&local_48);
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&key);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPrivkeyFromWif(
    void* handle, const char* wif, int network_type, char** privkey) {
  try {
    cfd::Initialize();
    if (privkey == nullptr) {
      warn(CFD_LOG_SOURCE, "privkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null.");
    }
    if (IsEmptyString(wif)) {
      warn(CFD_LOG_SOURCE, "wif is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. wif is null or empty.");
    }

    size_t wif_len = strnlen(wif, kPrivkeyWifUncompressSize + 1);
    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }
    Privkey key = Privkey::FromWif(
        wif, net_type, (wif_len != kPrivkeyWifUncompressSize));
    *privkey = CreateString(key.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}